

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::SimpSolver(SimpSolver *this)

{
  bool bVar1;
  CRef CVar2;
  int32_t *piVar3;
  double *pdVar4;
  int64_t *piVar5;
  bool *pbVar6;
  undefined8 *in_RDI;
  vec<Minisat::Lit> dummy;
  Solver *in_stack_000004a0;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  vec<char> *this_00;
  undefined1 learnt;
  ClauseDeleted *in_stack_fffffffffffffee8;
  vec<Minisat::Lit> *ps;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_fffffffffffffef0;
  ClauseAllocator *this_01;
  ElimLt local_28;
  ClauseDeleted local_20 [4];
  
  Solver::Solver(in_stack_000004a0);
  *in_RDI = &PTR__SimpSolver_00179c78;
  bVar1 = updateOptions();
  *(bool *)(in_RDI + 0x27f) = bVar1;
  *(undefined1 *)((long)in_RDI + 0x13f9) = 0;
  piVar3 = IntOption::operator_cast_to_int_(&opt_grow);
  *(int32_t *)((long)in_RDI + 0x13fc) = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_clause_lim);
  *(int32_t *)(in_RDI + 0x280) = *piVar3;
  piVar3 = IntOption::operator_cast_to_int_(&opt_subsumption_lim);
  *(int32_t *)((long)in_RDI + 0x1404) = *piVar3;
  pdVar4 = DoubleOption::operator_cast_to_double_(&opt_simp_garbage_frac);
  in_RDI[0x281] = *pdVar4;
  piVar5 = Int64Option::operator_cast_to_long_(&opt_max_simplify_step);
  in_RDI[0x282] = *piVar5;
  piVar3 = IntOption::operator_cast_to_int_(&opt_max_simp_cls);
  *(int32_t *)(in_RDI + 0x283) = *piVar3;
  pbVar6 = BoolOption::operator_cast_to_bool_(&opt_use_asymm);
  *(byte *)((long)in_RDI + 0x141c) = *pbVar6 & 1;
  pbVar6 = BoolOption::operator_cast_to_bool_(&opt_use_rcheck);
  *(byte *)((long)in_RDI + 0x141d) = *pbVar6 & 1;
  pbVar6 = BoolOption::operator_cast_to_bool_(&opt_use_elim);
  *(byte *)((long)in_RDI + 0x141e) = *pbVar6 & 1;
  *(undefined4 *)(in_RDI + 0x284) = 0;
  *(undefined4 *)((long)in_RDI + 0x1424) = 0;
  *(undefined4 *)(in_RDI + 0x285) = 0;
  *(undefined4 *)((long)in_RDI + 0x142c) = 1;
  *(undefined1 *)(in_RDI + 0x286) = 1;
  vec<unsigned_int>::vec((vec<unsigned_int> *)(in_RDI + 0x287));
  vec<char>::vec((vec<char> *)(in_RDI + 0x289));
  ClauseDeleted::ClauseDeleted(local_20,(ClauseAllocator *)(in_RDI + 0xa1));
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::OccLists
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  vec<int>::vec((vec<int> *)(in_RDI + 0x292));
  ElimLt::ElimLt(&local_28,(vec<int> *)(in_RDI + 0x292));
  Heap<Minisat::SimpSolver::ElimLt>::Heap
            ((Heap<Minisat::SimpSolver::ElimLt> *)in_stack_fffffffffffffef0,
             (ElimLt *)in_stack_fffffffffffffee8);
  this_01 = (ClauseAllocator *)(in_RDI + 0x299);
  Queue<unsigned_int>::Queue
            ((Queue<unsigned_int> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  ps = (vec<Minisat::Lit> *)(in_RDI + 0x29c);
  vec<char>::vec((vec<char> *)ps);
  this_00 = (vec<char> *)(in_RDI + 0x29e);
  vec<char>::vec(this_00);
  learnt = (undefined1)((ulong)this_00 >> 0x38);
  *(undefined4 *)(in_RDI + 0x2a0) = 0;
  *(undefined4 *)((long)in_RDI + 0x1504) = 0;
  vec<Minisat::Lit>::vec((vec<Minisat::Lit> *)(in_RDI + 0x2a2));
  vec<Minisat::Lit>::vec
            ((vec<Minisat::Lit> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc,(Lit *)0x15a26b);
  *(undefined1 *)((long)in_RDI + 0x51c) = 1;
  CVar2 = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(this_01,ps,(bool)learnt);
  *(CRef *)(in_RDI + 0x2a1) = CVar2;
  *(undefined1 *)(in_RDI + 0x92) = 0;
  vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)0x15a2c1);
  return;
}

Assistant:

SimpSolver::SimpSolver()
  : simp_reparsed_options(updateOptions())
  , parsing(false)
  , grow(opt_grow)
  , clause_lim(opt_clause_lim)
  , subsumption_lim(opt_subsumption_lim)
  , simp_garbage_frac(opt_simp_garbage_frac)
  , max_simp_steps(opt_max_simplify_step)
  , nr_max_simp_cls(opt_max_simp_cls)
  , use_asymm(opt_use_asymm)
  , use_rcheck(opt_use_rcheck)
  , use_elim(opt_use_elim)
  , merges(0)
  , asymm_lits(0)
  , eliminated_vars(0)
  , elimorder(1)
  , use_simplification(true)
  , occurs(ClauseDeleted(ca))
  , elim_heap(ElimLt(n_occ))
  , bwdsub_assigns(0)
  , n_touched(0)
{
    vec<Lit> dummy(1, lit_Undef);
    ca.extra_clause_field = true; // NOTE: must happen before allocating the dummy clause below.
    bwdsub_tmpunit = ca.alloc(dummy);
    remove_satisfied = false;
}